

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluStrUtil.cpp
# Opt level: O3

ostream * glu::detail::operator<<(ostream *str,TextureParameterValueStr *valueStr)

{
  int iVar1;
  ostream *poVar2;
  Enum<int,_2UL> local_10;
  
  iVar1 = *(int *)valueStr;
  if (iVar1 < 0x884c) {
    if (0x8139 < iVar1) {
      if (iVar1 - 0x813aU < 4) {
        poVar2 = (ostream *)std::ostream::operator<<(str,*(int *)(valueStr + 4));
        return poVar2;
      }
LAB_00182e69:
      local_10.m_getName = (GetNameFunc)(ulong)*(uint *)(valueStr + 4);
      poVar2 = tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_10,str);
      return poVar2;
    }
    if (iVar1 - 0x2800U < 2) {
      local_10.m_value = *(int *)(valueStr + 4);
      local_10.m_getName = getTextureFilterName;
    }
    else {
      if ((1 < iVar1 - 0x2802U) && (iVar1 != 0x8072)) goto LAB_00182e69;
      local_10.m_value = *(int *)(valueStr + 4);
      local_10.m_getName = getTextureWrapModeName;
    }
  }
  else if (iVar1 < 0x8e42) {
    if (iVar1 == 0x884c) {
      local_10.m_value = *(int *)(valueStr + 4);
      local_10.m_getName = getTextureCompareModeName;
    }
    else {
      if (iVar1 != 0x884d) goto LAB_00182e69;
      local_10.m_value = *(int *)(valueStr + 4);
      local_10.m_getName = getCompareFuncName;
    }
  }
  else if (iVar1 - 0x8e42U < 4) {
    local_10.m_value = *(int *)(valueStr + 4);
    local_10.m_getName = getTextureSwizzleName;
  }
  else {
    if (iVar1 != 0x90ea) goto LAB_00182e69;
    local_10.m_value = *(int *)(valueStr + 4);
    local_10.m_getName = getTextureDepthStencilModeName;
  }
  poVar2 = tcu::Format::Enum<int,_2UL>::toStream(&local_10,str);
  return poVar2;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const TextureParameterValueStr& valueStr)
{
	switch (valueStr.param)
	{
		case GL_TEXTURE_WRAP_S:
		case GL_TEXTURE_WRAP_T:
		case GL_TEXTURE_WRAP_R:
			return str << getTextureWrapModeStr(valueStr.value);

		case GL_TEXTURE_BASE_LEVEL:
		case GL_TEXTURE_MAX_LEVEL:
		case GL_TEXTURE_MAX_LOD:
		case GL_TEXTURE_MIN_LOD:
			return str << valueStr.value;

		case GL_TEXTURE_COMPARE_MODE:
			return str << getTextureCompareModeStr(valueStr.value);

		case GL_TEXTURE_COMPARE_FUNC:
			return str << getCompareFuncStr(valueStr.value);

		case GL_TEXTURE_SWIZZLE_R:
		case GL_TEXTURE_SWIZZLE_G:
		case GL_TEXTURE_SWIZZLE_B:
		case GL_TEXTURE_SWIZZLE_A:
			return str << getTextureSwizzleStr(valueStr.value);

		case GL_TEXTURE_MIN_FILTER:
		case GL_TEXTURE_MAG_FILTER:
			return str << getTextureFilterStr(valueStr.value);

		case GL_DEPTH_STENCIL_TEXTURE_MODE:
			return str << getTextureDepthStencilModeStr(valueStr.value);

		default:
			return str << tcu::toHex(valueStr.value);
	}
}